

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateElementDecl(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlElementPtr elem)

{
  xmlElementContentPtr pxVar1;
  _xmlElementContent *p_Var2;
  int iVar3;
  xmlChar *pxVar4;
  xmlElementPtr pxVar5;
  char *pcVar6;
  xmlChar *pxVar7;
  _xmlElementContent *p_Var8;
  xmlElementContentPtr *ppxVar9;
  xmlChar *pxVar10;
  int local_40;
  xmlChar *prefix;
  
  local_40 = 0;
  if ((doc != (xmlDocPtr)0x0) &&
     ((doc->intSubset != (_xmlDtd *)0x0 || (doc->extSubset != (_xmlDtd *)0x0)))) {
    if (elem == (xmlElementPtr)0x0) {
      local_40 = 1;
    }
    else {
      if (elem->etype == XML_ELEMENT_TYPE_MIXED) {
        local_40 = 1;
        ppxVar9 = &elem->content;
        while (((pxVar1 = *ppxVar9, pxVar1 != (xmlElementContentPtr)0x0 &&
                (pxVar1->type == XML_ELEMENT_CONTENT_OR)) &&
               (p_Var8 = pxVar1->c1, p_Var8 != (_xmlElementContent *)0x0))) {
          if (p_Var8->type == XML_ELEMENT_CONTENT_ELEMENT) {
            pxVar4 = p_Var8->name;
            p_Var8 = pxVar1;
            while (p_Var8 = p_Var8->c2, p_Var8 != (_xmlElementContent *)0x0) {
              if (p_Var8->type == XML_ELEMENT_CONTENT_ELEMENT) {
                iVar3 = xmlStrEqual(p_Var8->name,pxVar4);
                if ((iVar3 != 0) &&
                   (iVar3 = xmlStrEqual(p_Var8->prefix,pxVar1->c1->prefix), iVar3 != 0)) {
                  pxVar7 = pxVar1->c1->prefix;
                  if (pxVar7 == (xmlChar *)0x0) {
                    pxVar10 = (xmlChar *)0x0;
                    pcVar6 = "Definition of %s has duplicate references of %s\n";
                    pxVar7 = pxVar4;
                  }
                  else {
                    pcVar6 = "Definition of %s has duplicate references of %s:%s\n";
                    pxVar10 = pxVar4;
                  }
                  xmlErrValidNode(ctxt,(xmlNodePtr)elem,XML_DTD_CONTENT_ERROR,pcVar6,elem->name,
                                  pxVar7,pxVar10);
                  local_40 = 0;
                }
                break;
              }
              p_Var2 = p_Var8->c1;
              if ((p_Var2 == (_xmlElementContent *)0x0) ||
                 (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT)) break;
              iVar3 = xmlStrEqual(p_Var2->name,pxVar4);
              if ((iVar3 != 0) &&
                 (iVar3 = xmlStrEqual(p_Var8->c1->prefix,pxVar1->c1->prefix), iVar3 != 0)) {
                pxVar7 = pxVar1->c1->prefix;
                if (pxVar7 == (xmlChar *)0x0) {
                  pxVar10 = (xmlChar *)0x0;
                  pcVar6 = "Definition of %s has duplicate references to %s\n";
                  pxVar7 = pxVar4;
                }
                else {
                  pcVar6 = "Definition of %s has duplicate references to %s:%s\n";
                  pxVar10 = pxVar4;
                }
                xmlErrValidNode(ctxt,(xmlNodePtr)elem,XML_DTD_CONTENT_ERROR,pcVar6,elem->name,pxVar7
                                ,pxVar10);
                local_40 = 0;
              }
            }
          }
          ppxVar9 = &pxVar1->c2;
        }
      }
      else {
        local_40 = 1;
      }
      pxVar4 = xmlSplitQName4(elem->name,&prefix);
      if (pxVar4 == (xmlChar *)0x0) {
        xmlVErrMemory(ctxt);
        local_40 = 0;
      }
      else {
        if ((doc->intSubset != (_xmlDtd *)0x0) &&
           (pxVar5 = (xmlElementPtr)
                     xmlHashLookup2((xmlHashTablePtr)doc->intSubset->elements,pxVar4,prefix),
           pxVar5 != elem && pxVar5 != (xmlElementPtr)0x0)) {
          if (((pxVar5->prefix == elem->prefix) ||
              (iVar3 = xmlStrEqual(pxVar5->prefix,elem->prefix), iVar3 != 0)) &&
             (pxVar5->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
            local_40 = 0;
            xmlErrValidNode(ctxt,(xmlNodePtr)elem,XML_DTD_ELEM_REDEFINED,
                            "Redefinition of element %s\n",elem->name,(xmlChar *)0x0,(xmlChar *)0x0)
            ;
          }
        }
        if ((doc->extSubset != (_xmlDtd *)0x0) &&
           (pxVar5 = (xmlElementPtr)
                     xmlHashLookup2((xmlHashTablePtr)doc->extSubset->elements,pxVar4,prefix),
           pxVar5 != elem && pxVar5 != (xmlElementPtr)0x0)) {
          if (((pxVar5->prefix == elem->prefix) ||
              (iVar3 = xmlStrEqual(pxVar5->prefix,elem->prefix), iVar3 != 0)) &&
             (pxVar5->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
            local_40 = 0;
            xmlErrValidNode(ctxt,(xmlNodePtr)elem,XML_DTD_ELEM_REDEFINED,
                            "Redefinition of element %s\n",elem->name,(xmlChar *)0x0,(xmlChar *)0x0)
            ;
          }
        }
        (*xmlFree)(prefix);
      }
    }
  }
  return local_40;
}

Assistant:

int
xmlValidateElementDecl(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlElementPtr elem) {
    int ret = 1;
    xmlElementPtr tst;
    const xmlChar *localName;
    xmlChar *prefix;

    CHECK_DTD;

    if (elem == NULL) return(1);

    /* No Duplicate Types */
    if (elem->etype == XML_ELEMENT_TYPE_MIXED) {
	xmlElementContentPtr cur, next;
        const xmlChar *name;

	cur = elem->content;
	while (cur != NULL) {
	    if (cur->type != XML_ELEMENT_CONTENT_OR) break;
	    if (cur->c1 == NULL) break;
	    if (cur->c1->type == XML_ELEMENT_CONTENT_ELEMENT) {
		name = cur->c1->name;
		next = cur->c2;
		while (next != NULL) {
		    if (next->type == XML_ELEMENT_CONTENT_ELEMENT) {
		        if ((xmlStrEqual(next->name, name)) &&
			    (xmlStrEqual(next->prefix, cur->c1->prefix))) {
			    if (cur->c1->prefix == NULL) {
				xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
		   "Definition of %s has duplicate references of %s\n",
				       elem->name, name, NULL);
			    } else {
				xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
		   "Definition of %s has duplicate references of %s:%s\n",
				       elem->name, cur->c1->prefix, name);
			    }
			    ret = 0;
			}
			break;
		    }
		    if (next->c1 == NULL) break;
		    if (next->c1->type != XML_ELEMENT_CONTENT_ELEMENT) break;
		    if ((xmlStrEqual(next->c1->name, name)) &&
		        (xmlStrEqual(next->c1->prefix, cur->c1->prefix))) {
			if (cur->c1->prefix == NULL) {
			    xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
	       "Definition of %s has duplicate references to %s\n",
				   elem->name, name, NULL);
			} else {
			    xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_CONTENT_ERROR,
	       "Definition of %s has duplicate references to %s:%s\n",
				   elem->name, cur->c1->prefix, name);
			}
			ret = 0;
		    }
		    next = next->c2;
		}
	    }
	    cur = cur->c2;
	}
    }

    localName = xmlSplitQName4(elem->name, &prefix);
    if (localName == NULL) {
        xmlVErrMemory(ctxt);
        return(0);
    }

    /* VC: Unique Element Type Declaration */
    if (doc->intSubset != NULL) {
        tst = xmlHashLookup2(doc->intSubset->elements, localName, prefix);

        if ((tst != NULL ) && (tst != elem) &&
            ((tst->prefix == elem->prefix) ||
             (xmlStrEqual(tst->prefix, elem->prefix))) &&
            (tst->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
            xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_ELEM_REDEFINED,
                            "Redefinition of element %s\n",
                           elem->name, NULL, NULL);
            ret = 0;
        }
    }
    if (doc->extSubset != NULL) {
        tst = xmlHashLookup2(doc->extSubset->elements, localName, prefix);

        if ((tst != NULL ) && (tst != elem) &&
            ((tst->prefix == elem->prefix) ||
             (xmlStrEqual(tst->prefix, elem->prefix))) &&
            (tst->etype != XML_ELEMENT_TYPE_UNDEFINED)) {
            xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_ELEM_REDEFINED,
                            "Redefinition of element %s\n",
                           elem->name, NULL, NULL);
            ret = 0;
        }
    }

    /* One ID per Element Type
     * already done when registering the attribute
    if (xmlScanIDAttributeDecl(ctxt, elem) > 1) {
	ret = 0;
    } */

    xmlFree(prefix);
    return(ret);
}